

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::addMapPointer(CLIntercept *this,void *ptr,cl_map_flags flags,size_t size)

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  double __x;
  void *local_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (ptr != (void *)0x0) {
    __mutex = &this->m_Mutex;
    local_48 = ptr;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      uVar4 = std::__throw_system_error(iVar2);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar4);
    }
    p_Var1 = &(this->m_MapPointerInfoMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->m_MapPointerInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(void **)(p_Var6 + 1) < local_48])
    {
      if (*(void **)(p_Var6 + 1) >= local_48) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (p_Var6 = p_Var5, local_48 < *(void **)(p_Var5 + 1))) {
      p_Var6 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      pmVar3 = std::
               map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
               ::operator[](&this->m_MapPointerInfoMap,&local_48);
      pmVar3->Flags = flags;
      pmVar3->Size = size;
    }
    else {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"Ignoring duplicate mapped pointer.\n","");
      log(this,__x);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void CLIntercept::addMapPointer(
    const void* ptr,
    const cl_map_flags flags,
    const size_t size )
{
    if( ptr )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        if( m_MapPointerInfoMap.find(ptr) != m_MapPointerInfoMap.end() )
        {
            log( "Ignoring duplicate mapped pointer.\n" );
        }
        else
        {
            SMapPointerInfo&    mapPointerInfo = m_MapPointerInfoMap[ptr];

            mapPointerInfo.Flags = flags;
            mapPointerInfo.Size = size;
        }
    }
}